

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsrtCore.cpp
# Opt level: O0

JsErrorCode JsGetArrayBufferFreeFunction(JsValueRef arrayBuffer,ArrayBufferFreeFn *freeFn)

{
  anon_class_16_2_6e456132 fn;
  ArrayBufferFreeFn *local_20;
  ArrayBufferFreeFn *freeFn_local;
  JsValueRef arrayBuffer_local;
  
  if (arrayBuffer == (JsValueRef)0x0) {
    arrayBuffer_local._4_4_ = JsErrorInvalidArgument;
  }
  else if (freeFn == (ArrayBufferFreeFn *)0x0) {
    arrayBuffer_local._4_4_ = JsErrorNullArgument;
  }
  else {
    fn.freeFn = &local_20;
    fn.arrayBuffer = &freeFn_local;
    local_20 = freeFn;
    freeFn_local = (ArrayBufferFreeFn *)arrayBuffer;
    arrayBuffer_local._4_4_ =
         ContextAPINoScriptWrapper_NoRecord<JsGetArrayBufferFreeFunction::__0>(fn,false,false);
  }
  return arrayBuffer_local._4_4_;
}

Assistant:

CHAKRA_API
JsGetArrayBufferFreeFunction(
    _In_ JsValueRef arrayBuffer,
    _Out_ ArrayBufferFreeFn* freeFn)
{
  VALIDATE_JSREF(arrayBuffer);
  PARAM_NOT_NULL(freeFn);
  return ContextAPINoScriptWrapper_NoRecord(
      [&](Js::ScriptContext* scriptContext) -> JsErrorCode {
        if (!Js::VarIs<Js::ArrayBuffer>(arrayBuffer))
        {
          return JsErrorInvalidArgument;
        }

        *freeFn = Js::VarTo<Js::ArrayBuffer>(arrayBuffer)->GetArrayBufferFreeFn();
        return JsNoError;
      });
}